

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O2

int aead_aes256gcm_setup_crypto(ptls_aead_context_t *ctx,int is_enc,void *key)

{
  aead_aesgcm_setup_crypto(ctx,is_enc,key,0x20);
  return 0;
}

Assistant:

static int aead_aes256gcm_setup_crypto(ptls_aead_context_t *ctx, int is_enc, const void *key)
{
    return aead_aesgcm_setup_crypto(ctx, is_enc, key, PTLS_AES256_KEY_SIZE);
}